

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

bool __thiscall BigInt::operator==(BigInt *this,BigInt *b)

{
  __type_conflict _Var1;
  BigInt local_58;
  BigInt local_38;
  BigInt *local_18;
  BigInt *b_local;
  BigInt *this_local;
  
  local_18 = b;
  b_local = this;
  to_string_abi_cxx11_(&local_38);
  to_string_abi_cxx11_(&local_58);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_38,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return _Var1;
}

Assistant:

bool BigInt::operator==(BigInt& b) {
    return (this->to_string() == b.to_string());
}